

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenByteBufferLength_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,char *bb_name)

{
  allocator<char> local_22;
  undefined1 local_21;
  char *local_20;
  char *bb_name_local;
  KotlinGenerator *this_local;
  string *bb_len;
  
  local_21 = 0;
  local_20 = bb_name;
  bb_name_local = (char *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,bb_name,&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".capacity()");
  return __return_storage_ptr__;
}

Assistant:

std::string GenByteBufferLength(const char *bb_name) const {
    std::string bb_len = bb_name;
    bb_len += ".capacity()";
    return bb_len;
  }